

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O3

void __thiscall icu_63::RegexCompile::fixLiterals(RegexCompile *this,UBool split)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  ushort uVar4;
  uint offset;
  UChar32 c;
  int32_t iVar5;
  uint uVar6;
  int index;
  int32_t type;
  bool bVar7;
  
  sVar1 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    index = (this->fLiteralChars).fUnion.fFields.fLength;
  }
  else {
    index = (int)sVar1 >> 5;
  }
  if (index != 0) {
    this_00 = &this->fLiteralChars;
    bVar7 = split == '\0';
    do {
      offset = icu_63::UnicodeString::moveIndex32(this_00,index,-1);
      c = icu_63::UnicodeString::char32At(this_00,offset);
      if (bVar7) {
        if ((this->fModeFlags & 2) != 0) {
          icu_63::UnicodeString::foldCase(this_00,0);
          sVar1 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this->fLiteralChars).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          offset = icu_63::UnicodeString::moveIndex32(this_00,iVar5,-1);
          c = icu_63::UnicodeString::char32At(this_00,offset);
        }
        if (offset == 0) {
          if (((this->fModeFlags & 2) == 0) ||
             (UVar3 = u_hasBinaryProperty_63(c,UCHAR_CASE_SENSITIVE), UVar3 == '\0')) {
            iVar5 = 3;
          }
          else {
            iVar5 = 0x27;
          }
          iVar5 = buildOp(this,iVar5,c);
          appendOp(this,iVar5);
        }
        else {
          if ((((this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags < 0) &&
              (0xffffff < (this->fLiteralChars).fUnion.fFields.fLength)) ||
             (((this->fRXPat->fLiteralText).fUnion.fStackFields.fLengthAndFlags < 0 &&
              (0xffffff < (this->fRXPat->fLiteralText).fUnion.fFields.fLength)))) {
            error(this,U_REGEX_PATTERN_TOO_BIG);
          }
          sVar1 = (this->fRXPat->fLiteralText).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this->fRXPat->fLiteralText).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          type = 0x28;
          if ((this->fModeFlags & 2) == 0) {
            type = 4;
          }
          iVar5 = buildOp(this,type,iVar5);
          appendOp(this,iVar5);
          sVar1 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this->fLiteralChars).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          iVar5 = buildOp(this,5,iVar5);
          appendOp(this,iVar5);
          sVar1 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this->fLiteralChars).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          icu_63::UnicodeString::doAppend(&this->fRXPat->fLiteralText,this_00,0,iVar5);
        }
        uVar2 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
        uVar4 = 2;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar2 & 0x1e;
        }
        (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags = uVar4;
        return;
      }
      uVar2 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
      if (offset == 0 && (uVar2 & 1) != 0) {
        icu_63::UnicodeString::unBogus(this_00);
      }
      else {
        if ((short)uVar2 < 0) {
          uVar6 = (this->fLiteralChars).fUnion.fFields.fLength;
        }
        else {
          uVar6 = (int)(short)uVar2 >> 5;
        }
        if (offset < uVar6) {
          if ((int)offset < 0x400) {
            (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags =
                 (ushort)(offset << 5) | uVar2 & 0x1f;
          }
          else {
            (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
            (this->fLiteralChars).fUnion.fFields.fLength = offset;
          }
        }
      }
      fixLiterals(this,'\0');
      icu_63::UnicodeString::append(this_00,c);
      sVar1 = (this->fLiteralChars).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        index = (this->fLiteralChars).fUnion.fFields.fLength;
      }
      else {
        index = (int)sVar1 >> 5;
      }
      bVar7 = true;
    } while (index != 0);
  }
  return;
}

Assistant:

void    RegexCompile::fixLiterals(UBool split) {

    // If no literal characters have been scanned but not yet had code generated
    //   for them, nothing needs to be done.
    if (fLiteralChars.length() == 0) {
        return;
    }

    int32_t indexOfLastCodePoint = fLiteralChars.moveIndex32(fLiteralChars.length(), -1);
    UChar32 lastCodePoint = fLiteralChars.char32At(indexOfLastCodePoint);

    // Split:  We need to  ensure that the last item in the compiled pattern
    //     refers only to the last literal scanned in the pattern, so that
    //     quantifiers (*, +, etc.) affect only it, and not a longer string.
    //     Split before case folding for case insensitive matches.

    if (split) {
        fLiteralChars.truncate(indexOfLastCodePoint);
        fixLiterals(FALSE);   // Recursive call, emit code to match the first part of the string.
                              //  Note that the truncated literal string may be empty, in which case
                              //  nothing will be emitted.

        literalChar(lastCodePoint);  // Re-add the last code point as if it were a new literal.
        fixLiterals(FALSE);          // Second recursive call, code for the final code point.
        return;
    }

    // If we are doing case-insensitive matching, case fold the string.  This may expand
    //   the string, e.g. the German sharp-s turns into "ss"
    if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
        fLiteralChars.foldCase();
        indexOfLastCodePoint = fLiteralChars.moveIndex32(fLiteralChars.length(), -1);
        lastCodePoint = fLiteralChars.char32At(indexOfLastCodePoint);
    }

    if (indexOfLastCodePoint == 0) {
        // Single character, emit a URX_ONECHAR op to match it.
        if ((fModeFlags & UREGEX_CASE_INSENSITIVE) &&
                 u_hasBinaryProperty(lastCodePoint, UCHAR_CASE_SENSITIVE)) {
            appendOp(URX_ONECHAR_I, lastCodePoint);
        } else {
            appendOp(URX_ONECHAR, lastCodePoint);
        }
    } else {
        // Two or more chars, emit a URX_STRING to match them.
        if (fLiteralChars.length() > 0x00ffffff || fRXPat->fLiteralText.length() > 0x00ffffff) {
            error(U_REGEX_PATTERN_TOO_BIG);
        }
        if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
            appendOp(URX_STRING_I, fRXPat->fLiteralText.length());
        } else {
            // TODO here:  add optimization to split case sensitive strings of length two
            //             into two single char ops, for efficiency.
            appendOp(URX_STRING, fRXPat->fLiteralText.length());
        }
        appendOp(URX_STRING_LEN, fLiteralChars.length());

        // Add this string into the accumulated strings of the compiled pattern.
        fRXPat->fLiteralText.append(fLiteralChars);
    }

    fLiteralChars.remove();
}